

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  parameter_type P;
  parameter_type P_00;
  parameter_type P_01;
  parameter_type P_02;
  parameter_type P_03;
  parameter_type P_04;
  parameter_type P_05;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  mrg5 *this;
  mrg4 *this_00;
  yarn3 *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *in_RSI;
  int in_EDI;
  Ziff_32 r_14;
  r250_32 r_13;
  yarn5s r_12;
  yarn5 r_11;
  yarn4 r_10;
  yarn3s r_9;
  yarn3 r_8;
  yarn2 r_7;
  mrg5s r_6;
  mrg5 r_5;
  mrg4 r_4;
  mrg3s r_3;
  mrg3 r_2;
  mrg2 r_1;
  lcg64 r;
  string arg;
  int argi;
  string generator;
  long L;
  long split;
  long runs;
  undefined7 in_stack_fffffffffffef758;
  undefined1 in_stack_fffffffffffef75f;
  parameter_type in_stack_fffffffffffef760;
  int in_stack_fffffffffffef76c;
  undefined8 in_stack_fffffffffffef770;
  uint in_stack_fffffffffffef788;
  uint in_stack_fffffffffffef78c;
  lcg64 *in_stack_fffffffffffef790;
  uint in_stack_fffffffffffef7b8;
  uint in_stack_fffffffffffef7bc;
  yarn2 *in_stack_fffffffffffef7c0;
  uint in_stack_fffffffffffef7d8;
  uint in_stack_fffffffffffef7dc;
  uint s;
  mrg3s *in_stack_fffffffffffef7e0;
  uint in_stack_fffffffffffef808;
  undefined4 in_stack_fffffffffffef80c;
  uint s_00;
  uint in_stack_fffffffffffef838;
  undefined4 in_stack_fffffffffffef83c;
  uint s_01;
  long in_stack_fffffffffffef918;
  long in_stack_fffffffffffef920;
  long in_stack_fffffffffffef928;
  yarn5s *in_stack_fffffffffffef930;
  allocator local_81;
  string local_80 [52];
  int local_4c;
  string local_48 [32];
  long local_28;
  long local_20;
  long local_18;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 0;
  local_20 = 0;
  local_28 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::__cxx11::string::string(local_48);
  local_4c = 1;
  if (local_8 == 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Tina\'s Random Number Generator Library\n\n");
    poVar4 = std::operator<<(poVar4,"(P) & (C) by Heiko Bauke, 2000-2022\n\n");
    poVar4 = std::operator<<(poVar4,"two-domensional Ising model (Wolff algorithm)\n");
    poVar4 = std::operator<<(poVar4,"---------------------------------------------\n\n");
    poVar4 = std::operator<<(poVar4,"synopsis:\n");
    poVar4 = std::operator<<(poVar4,"$ ");
    poVar4 = std::operator<<(poVar4,(char *)*local_10);
    poVar4 = std::operator<<(poVar4," --gen generator --runs runs --split split --size size\n");
    poVar4 = std::operator<<(poVar4,"try:\n");
    poVar4 = std::operator<<(poVar4,"$ ");
    poVar4 = std::operator<<(poVar4,(char *)*local_10);
    std::operator<<(poVar4," --gen lcg64 --runs 100000 --split 1 --size 16\n");
    exit(1);
  }
  do {
    if (local_8 <= local_4c) {
      P.a._7_1_ = in_stack_fffffffffffef75f;
      P.a._0_7_ = in_stack_fffffffffffef758;
      P.b._0_4_ = in_stack_fffffffffffef760.a[0];
      P.b._4_4_ = in_stack_fffffffffffef760.a[1];
      trng::lcg64::lcg64((lcg64 *)0x103f75,P);
      trng::lcg64::split(in_stack_fffffffffffef790,in_stack_fffffffffffef78c,
                         in_stack_fffffffffffef788);
      this = (mrg5 *)trng::lcg64::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      s_01 = CONCAT13(bVar2,(int3)in_stack_fffffffffffef83c);
      if (bVar2) {
        wolff_main<trng::lcg64>
                  ((lcg64 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      trng::mrg2::mrg2((mrg2 *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758),
                       (parameter_type)in_stack_fffffffffffef760.a);
      trng::mrg2::split((mrg2 *)in_stack_fffffffffffef7c0,in_stack_fffffffffffef7bc,
                        in_stack_fffffffffffef7b8);
      trng::mrg2::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::mrg2>
                  ((mrg2 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      P_02.a[1] = (int)in_stack_fffffffffffef770;
      P_02.a[2] = (int)((ulong)in_stack_fffffffffffef770 >> 0x20);
      P_02.a[0] = in_stack_fffffffffffef76c;
      trng::mrg3::mrg3((mrg3 *)0x1040ec,P_02);
      trng::mrg3::split((mrg3 *)in_stack_fffffffffffef7e0,in_stack_fffffffffffef7dc,
                        in_stack_fffffffffffef7d8);
      trng::mrg3::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::mrg3>
                  ((mrg3 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      P_03.a[1] = (int)in_stack_fffffffffffef770;
      P_03.a[2] = (int)((ulong)in_stack_fffffffffffef770 >> 0x20);
      P_03.a[0] = in_stack_fffffffffffef76c;
      trng::mrg3s::mrg3s((mrg3s *)0x1041bf,P_03);
      trng::mrg3s::split(in_stack_fffffffffffef7e0,in_stack_fffffffffffef7dc,
                         in_stack_fffffffffffef7d8);
      this_00 = (mrg4 *)trng::mrg3s::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      s_00 = CONCAT13(bVar2,(int3)in_stack_fffffffffffef80c);
      if (bVar2) {
        wolff_main<trng::mrg3s>
                  ((mrg3s *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      P_00.a[1]._3_1_ = in_stack_fffffffffffef75f;
      P_00.a._0_7_ = in_stack_fffffffffffef758;
      P_00.a[2] = in_stack_fffffffffffef760.a[0];
      P_00.a[3] = in_stack_fffffffffffef760.a[1];
      trng::mrg4::mrg4((mrg4 *)0x10426b,P_00);
      trng::mrg4::split(this_00,s_00,in_stack_fffffffffffef808);
      trng::mrg4::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::mrg4>
                  ((mrg4 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      trng::mrg5::mrg5((mrg5 *)in_stack_fffffffffffef760.a,
                       (parameter_type *)
                       CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758));
      trng::mrg5::split(this,s_01,in_stack_fffffffffffef838);
      trng::mrg5::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::mrg5>
                  ((mrg5 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      trng::mrg5s::mrg5s((mrg5s *)in_stack_fffffffffffef760.a,
                         (parameter_type *)
                         CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758));
      trng::mrg5s::split((mrg5s *)this,s_01,in_stack_fffffffffffef838);
      this_01 = (yarn3 *)trng::mrg5s::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      s = CONCAT13(bVar2,(int3)in_stack_fffffffffffef7dc);
      if (bVar2) {
        wolff_main<trng::mrg5s>
                  ((mrg5s *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      trng::yarn2::yarn2((yarn2 *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758),
                         in_stack_fffffffffffef760);
      trng::yarn2::split(in_stack_fffffffffffef7c0,in_stack_fffffffffffef7bc,
                         in_stack_fffffffffffef7b8);
      trng::yarn2::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::yarn2>
                  ((yarn2 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      P_04.a[1] = (int)in_stack_fffffffffffef770;
      P_04.a[2] = (int)((ulong)in_stack_fffffffffffef770 >> 0x20);
      P_04.a[0] = in_stack_fffffffffffef76c;
      trng::yarn3::yarn3((yarn3 *)0x1044f8,P_04);
      trng::yarn3::split(this_01,s,in_stack_fffffffffffef7d8);
      trng::yarn3::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::yarn3>
                  ((yarn3 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      P_05.a[1] = (int)in_stack_fffffffffffef770;
      P_05.a[2] = (int)((ulong)in_stack_fffffffffffef770 >> 0x20);
      P_05.a[0] = in_stack_fffffffffffef76c;
      trng::yarn3s::yarn3s((yarn3s *)0x1045bf,P_05);
      trng::yarn3s::split((yarn3s *)this_01,s,in_stack_fffffffffffef7d8);
      trng::yarn3s::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::yarn3s>
                  ((yarn3s *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      P_01.a[1]._3_1_ = in_stack_fffffffffffef75f;
      P_01.a._0_7_ = in_stack_fffffffffffef758;
      P_01.a[2] = in_stack_fffffffffffef760.a[0];
      P_01.a[3] = in_stack_fffffffffffef760.a[1];
      trng::yarn4::yarn4((yarn4 *)0x10465f,P_01);
      trng::yarn4::split((yarn4 *)this_00,s_00,in_stack_fffffffffffef808);
      trng::yarn4::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::yarn4>
                  ((yarn4 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      trng::yarn5::yarn5((yarn5 *)in_stack_fffffffffffef760.a,
                         (parameter_type *)
                         CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758));
      trng::yarn5::split((yarn5 *)this,s_01,in_stack_fffffffffffef838);
      trng::yarn5::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::yarn5>
                  ((yarn5 *)in_stack_fffffffffffef930,in_stack_fffffffffffef928,
                   in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      trng::yarn5s::yarn5s
                ((yarn5s *)in_stack_fffffffffffef760.a,
                 (parameter_type *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758));
      trng::yarn5s::split((yarn5s *)this,s_01,in_stack_fffffffffffef838);
      trng::yarn5s::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::yarn5s>
                  (in_stack_fffffffffffef930,in_stack_fffffffffffef928,in_stack_fffffffffffef920,
                   in_stack_fffffffffffef918);
      }
      trng::lagfib2xor<unsigned_int,_103U,_250U>::lagfib2xor
                ((lagfib2xor<unsigned_int,_103U,_250U> *)in_stack_fffffffffffef760.a);
      trng::lagfib2xor<unsigned_int,_103U,_250U>::name();
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        wolff_main<trng::lagfib2xor<unsigned_int,103u,250u>>
                  ((lagfib2xor<unsigned_int,_103U,_250U> *)in_stack_fffffffffffef930,
                   in_stack_fffffffffffef928,in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::lagfib4xor
                ((lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *)in_stack_fffffffffffef760.a)
      ;
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::name();
      bVar2 = std::operator==(__lhs,(char *)CONCAT17(in_stack_fffffffffffef75f,
                                                     in_stack_fffffffffffef758));
      if (bVar2) {
        wolff_main<trng::lagfib4xor<unsigned_int,471u,1586u,6988u,9689u>>
                  ((lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *)in_stack_fffffffffffef930,
                   in_stack_fffffffffffef928,in_stack_fffffffffffef920,in_stack_fffffffffffef918);
      }
      local_4 = 0;
      std::__cxx11::string::~string(local_48);
      return local_4;
    }
    pcVar1 = (char *)local_10[local_4c];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar1,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffef760.a,
                            (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758));
    if (bVar2) {
      local_4c = local_4c + 1;
      if (local_8 <= local_4c) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
        poVar4 = std::operator<<(poVar4,local_80);
        std::operator<<(poVar4,'\n');
        exit(1);
      }
      std::__cxx11::string::operator=(local_48,(char *)local_10[local_4c]);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffef760.a,
                              (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758))
      ;
      if (bVar2) {
        local_4c = local_4c + 1;
        if (local_8 <= local_4c) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
          poVar4 = std::operator<<(poVar4,local_80);
          std::operator<<(poVar4,'\n');
          exit(1);
        }
        iVar3 = atoi((char *)local_10[local_4c]);
        local_18 = (long)iVar3;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffef760.a,
                                (char *)CONCAT17(in_stack_fffffffffffef75f,in_stack_fffffffffffef758
                                                ));
        if (bVar2) {
          local_4c = local_4c + 1;
          if (local_8 <= local_4c) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
            poVar4 = std::operator<<(poVar4,local_80);
            std::operator<<(poVar4,'\n');
            exit(1);
          }
          iVar3 = atoi((char *)local_10[local_4c]);
          local_20 = (long)iVar3;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffef760.a,
                                  (char *)CONCAT17(in_stack_fffffffffffef75f,
                                                   in_stack_fffffffffffef758));
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"unknown argument ");
            poVar4 = std::operator<<(poVar4,local_80);
            std::operator<<(poVar4,'\n');
            exit(1);
          }
          local_4c = local_4c + 1;
          if (local_8 <= local_4c) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"missung argument for parameter ");
            poVar4 = std::operator<<(poVar4,local_80);
            std::operator<<(poVar4,'\n');
            exit(1);
          }
          iVar3 = atoi((char *)local_10[local_4c]);
          local_28 = (long)iVar3;
        }
      }
    }
    local_4c = local_4c + 1;
    std::__cxx11::string::~string(local_80);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
  long runs{0}, split{0}, L{0};
  std::string generator;
  int argi{1};
  if (argc == 1) {
    std::cerr << "Tina's Random Number Generator Library\n\n"
              << "(P) & (C) by Heiko Bauke, 2000-2022\n\n"
              << "two-domensional Ising model (Wolff algorithm)\n"
              << "---------------------------------------------\n\n"
              << "synopsis:\n"
              << "$ " << argv[0] << " --gen generator --runs runs --split split --size size\n"
              << "try:\n"
              << "$ " << argv[0] << " --gen lcg64 --runs 100000 --split 1 --size 16\n";
    std::exit(EXIT_FAILURE);
  }
  while (argi < argc) {
    std::string arg(argv[argi]);
    if (arg == "--gen") {
      ++argi;
      if (argi < argc) {
        generator = argv[argi];
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--runs") {
      ++argi;
      if (argi < argc) {
        runs = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--split") {
      ++argi;
      if (argi < argc) {
        split = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else if (arg == "--size") {
      ++argi;
      if (argi < argc) {
        L = std::atoi(argv[argi]);
        ++argi;
      } else {
        std::cerr << "missung argument for parameter " << arg << '\n';
        std::exit(EXIT_FAILURE);
      }
    } else {
      std::cerr << "unknown argument " << arg << '\n';
      std::exit(EXIT_FAILURE);
    }
  }
  {
    trng::lcg64 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg2 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg3 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg3s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg4 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg5 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::mrg5s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn2 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn3 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn3s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn4 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn5 r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::yarn5s r;
    r.split(split, 0);
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::r250_32 r;
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  {
    trng::Ziff_32 r;
    if (generator == r.name())
      wolff_main(r, runs, split, L);
  }
  return EXIT_SUCCESS;
}